

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O0

void Assimp::BlenderImporter::CheckActualType(ElemBase *dt,char *check)

{
  int iVar1;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar2;
  basic_formatter *this;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  string local_38;
  char *local_18;
  char *check_local;
  ElemBase *dt_local;
  
  local_18 = check;
  check_local = (char *)dt;
  if (dt != (ElemBase *)0x0) {
    iVar1 = strcmp(dt->dna_type,check);
    if (iVar1 != 0) {
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter(&local_1b0);
      pbVar2 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                         &local_1b0,(char (*) [20])"Expected object at ");
      pbVar2 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_(pbVar2,std::hex);
      pbVar2 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_(pbVar2,(ElemBase **)&check_local);
      pbVar2 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_(pbVar2,(char (*) [17])0xbc6519);
      pbVar2 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_(pbVar2,&local_18);
      pbVar2 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_(pbVar2,(char (*) [27])"`, but it claims to be a `");
      pbVar2 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_(pbVar2,(char **)(check_local + 8));
      this = (basic_formatter *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       (pbVar2,(char (*) [9])"`instead");
      Formatter::basic_formatter::operator_cast_to_string(&local_38,this);
      LogFunctions<Assimp::BlenderImporter>::ThrowException(&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter(&local_1b0);
    }
    return;
  }
  __assert_fail("dt",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Blender/BlenderLoader.cpp"
                ,0x30a,
                "static void Assimp::BlenderImporter::CheckActualType(const ElemBase *, const char *)"
               );
}

Assistant:

void BlenderImporter::CheckActualType(const ElemBase* dt, const char* check)
{
    ai_assert(dt);
    if (strcmp(dt->dna_type,check)) {
        ThrowException((format(),
            "Expected object at ",std::hex,dt," to be of type `",check,
            "`, but it claims to be a `",dt->dna_type,"`instead"
        ));
    }
}